

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Type __thiscall wasm::TranslateToFuzzReader::getSubType(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  BasicHeapType BVar2;
  Nullability nullable;
  Exactness EVar3;
  Type *pTVar4;
  uintptr_t *puVar5;
  undefined1 auVar6 [8];
  Iterator IVar7;
  Type local_80;
  Type local_78;
  Type *local_70;
  undefined1 local_68 [8];
  Iterator __begin2;
  vector<wasm::Type,_std::allocator<wasm::Type>_> types;
  Type local_38;
  Type type_local;
  
  local_38.id = type.id;
  if ((type.id & 1) == 0 || type.id < 7) {
    if ((type.id & 1) == 0 && 6 < type.id) {
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
           (size_t)Type::getHeapType(&local_38);
      if ((this->funcContext != (FunctionCreationContext *)0x0) ||
         (bVar1 = HeapType::isMaybeShared
                            ((HeapType *)
                             &__begin2.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index,exn), local_80.id = local_38.id, !bVar1)) {
        bVar1 = Type::isExact(&local_38);
        if (bVar1) {
          bVar1 = HeapType::isBottom((HeapType *)
                                     &__begin2.
                                      super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                      .index);
          if ((!bVar1) && (bVar1 = Random::oneIn(&this->random,0x14), bVar1)) {
            BVar2 = HeapType::getBottom((HeapType *)
                                        &__begin2.
                                         super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                         .index);
            __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
                 (size_t)BVar2;
          }
        }
        else {
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
               (size_t)getSubType(this,(HeapType)
                                       __begin2.
                                       super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                       .index);
        }
        nullable = getSubType(this,(uint)(((uint)local_38.id & 3) == 2 && 6 < local_38.id));
        EVar3 = Type::getExactness(&local_38);
        Type::Type((Type *)local_68,
                   (HeapType)
                   __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                   index,nullable,(uint)(EVar3 == Exact));
        bVar1 = GCTypeUtils::isUninhabitable((Type)local_68);
        if (((!bVar1) || (bVar1 = GCTypeUtils::isUninhabitable(local_38), bVar1)) ||
           (bVar1 = Random::oneIn(&this->random,0x14), pTVar4 = &local_38, bVar1)) {
          pTVar4 = (Type *)local_68;
        }
        local_80.id = pTVar4->id;
      }
    }
    else {
      local_80.id = type.id;
      if (6 < type.id) {
        __assert_fail("type.isBasic()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0x15b9,"Type wasm::TranslateToFuzzReader::getSubType(Type)");
      }
    }
  }
  else {
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_68 = (undefined1  [8])&local_38;
    IVar7 = Type::end(&local_38);
    local_70 = IVar7.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
    pTVar4 = (Type *)0x0;
    auVar6 = (undefined1  [8])&local_38;
    while ((pTVar4 != (Type *)IVar7.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index || (auVar6 != (undefined1  [8])local_70))) {
      puVar5 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)local_68);
      local_78 = getSubType(this,*puVar5);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                 &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                 ,&local_78);
      pTVar4 = (Type *)((long)&(__begin2.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1);
      auVar6 = local_68;
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar4;
    }
    wasm::Type::Type(&local_80,
                     (vector *)
                     &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      index);
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)
               &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
  }
  return (Type)local_80.id;
}

Assistant:

Type TranslateToFuzzReader::getSubType(Type type) {
  if (type.isTuple()) {
    std::vector<Type> types;
    for (const auto& t : type) {
      types.push_back(getSubType(t));
    }
    return Type(types);
  } else if (type.isRef()) {
    auto heapType = type.getHeapType();
    // Do not generate non-nullable exnrefs in global positions (they cannot be
    // created in wasm, nor imported from JS).
    if (!funcContext && heapType.isMaybeShared(HeapType::exn)) {
      return type;
    }
    if (type.isExact()) {
      // The only other possible heap type is bottom, but we don't want to
      // generate too many bottom types.
      if (!heapType.isBottom() && oneIn(20)) {
        heapType = heapType.getBottom();
      }
    } else {
      heapType = getSubType(heapType);
    }
    auto nullability = getSubType(type.getNullability());
    auto exactness = getSubType(type.getExactness());
    auto subType = Type(heapType, nullability, exactness);
    // We don't want to emit lots of uninhabitable types like (ref none), so
    // avoid them with high probability. Specifically, if the original type was
    // inhabitable then return that; avoid adding more uninhabitability.
    if (GCTypeUtils::isUninhabitable(subType) &&
        !GCTypeUtils::isUninhabitable(type) && !oneIn(20)) {
      return type;
    }
    return subType;
  } else {
    // This is an MVP type without subtypes.
    assert(type.isBasic());
    return type;
  }
}